

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O2

int Curl_getaddrinfo_ex(char *nodename,char *servname,addrinfo *hints,Curl_addrinfo **result)

{
  addrinfo *paVar1;
  sockaddr *psVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  Curl_addrinfo *pCVar13;
  sockaddr *psVar14;
  char *pcVar15;
  Curl_addrinfo *pCVar16;
  Curl_addrinfo *cahead;
  addrinfo **__pai;
  Curl_addrinfo *pCVar17;
  int local_44;
  addrinfo *aihead;
  
  *result = (Curl_addrinfo *)0x0;
  __pai = (addrinfo **)&aihead;
  local_44 = getaddrinfo(nodename,servname,(addrinfo *)hints,__pai);
  if (local_44 == 0) {
    cahead = (Curl_addrinfo *)0x0;
    local_44 = -10;
    pCVar16 = (Curl_addrinfo *)0x0;
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      pCVar13 = pCVar16;
      if (((paVar1->ai_family == 2) && (paVar1->ai_addr != (sockaddr *)0x0)) &&
         (0xf < paVar1->ai_addrlen)) {
        pCVar13 = (Curl_addrinfo *)(*Curl_cmalloc)(0x30);
        if (pCVar13 == (Curl_addrinfo *)0x0) goto LAB_005981ba;
        iVar4 = paVar1->ai_family;
        iVar5 = paVar1->ai_socktype;
        iVar6 = paVar1->ai_protocol;
        pCVar13->ai_flags = paVar1->ai_flags;
        pCVar13->ai_family = iVar4;
        pCVar13->ai_socktype = iVar5;
        pCVar13->ai_protocol = iVar6;
        pCVar13->ai_addrlen = 0x10;
        pCVar13->ai_canonname = (char *)0x0;
        pCVar13->ai_addr = (sockaddr *)0x0;
        pCVar13->ai_next = (Curl_addrinfo *)0x0;
        psVar14 = (sockaddr *)(*Curl_cmalloc)(0x10);
        pCVar13->ai_addr = psVar14;
        if (psVar14 == (sockaddr *)0x0) {
LAB_00598216:
          (*Curl_cfree)(pCVar13);
          goto LAB_005981ba;
        }
        psVar2 = paVar1->ai_addr;
        cVar7 = psVar2->sa_data[0];
        cVar8 = psVar2->sa_data[1];
        cVar9 = psVar2->sa_data[2];
        cVar10 = psVar2->sa_data[3];
        cVar11 = psVar2->sa_data[4];
        cVar12 = psVar2->sa_data[5];
        uVar3 = *(undefined8 *)(psVar2->sa_data + 6);
        psVar14->sa_family = psVar2->sa_family;
        psVar14->sa_data[0] = cVar7;
        psVar14->sa_data[1] = cVar8;
        psVar14->sa_data[2] = cVar9;
        psVar14->sa_data[3] = cVar10;
        psVar14->sa_data[4] = cVar11;
        psVar14->sa_data[5] = cVar12;
        *(undefined8 *)(psVar14->sa_data + 6) = uVar3;
        if (paVar1->ai_canonname != (char *)0x0) {
          pcVar15 = (*Curl_cstrdup)(paVar1->ai_canonname);
          pCVar13->ai_canonname = pcVar15;
          if (pcVar15 == (char *)0x0) {
            (*Curl_cfree)(pCVar13->ai_addr);
            goto LAB_00598216;
          }
        }
        pCVar17 = pCVar13;
        if (cahead != (Curl_addrinfo *)0x0) {
          pCVar17 = cahead;
        }
        cahead = pCVar17;
        if (pCVar16 != (Curl_addrinfo *)0x0) {
          pCVar16->ai_next = pCVar13;
        }
      }
      pCVar16 = pCVar13;
      __pai = &paVar1->ai_next;
    }
    local_44 = 0;
LAB_005981ba:
    if (aihead != (addrinfo *)0x0) {
      freeaddrinfo((addrinfo *)aihead);
    }
    if (paVar1 == (addrinfo *)0x0) {
      local_44 = (uint)(cahead != (Curl_addrinfo *)0x0) * 2 + -2;
    }
    else {
      Curl_freeaddrinfo(cahead);
      cahead = (Curl_addrinfo *)0x0;
    }
    *result = cahead;
  }
  return local_44;
}

Assistant:

int
Curl_getaddrinfo_ex(const char *nodename,
                    const char *servname,
                    const struct addrinfo *hints,
                    Curl_addrinfo **result)
{
  const struct addrinfo *ai;
  struct addrinfo *aihead;
  Curl_addrinfo *cafirst = NULL;
  Curl_addrinfo *calast = NULL;
  Curl_addrinfo *ca;
  size_t ss_size;
  int error;

  *result = NULL; /* assume failure */

  error = getaddrinfo(nodename, servname, hints, &aihead);
  if(error)
    return error;

  /* traverse the addrinfo list */

  for(ai = aihead; ai != NULL; ai = ai->ai_next) {

    /* ignore elements with unsupported address family, */
    /* settle family-specific sockaddr structure size.  */
    if(ai->ai_family == AF_INET)
      ss_size = sizeof(struct sockaddr_in);
#ifdef ENABLE_IPV6
    else if(ai->ai_family == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
#endif
    else
      continue;

    /* ignore elements without required address info */
    if((ai->ai_addr == NULL) || !(ai->ai_addrlen > 0))
      continue;

    /* ignore elements with bogus address size */
    if((size_t)ai->ai_addrlen < ss_size)
      continue;

    ca = malloc(sizeof(Curl_addrinfo));
    if(!ca) {
      error = EAI_MEMORY;
      break;
    }

    /* copy each structure member individually, member ordering, */
    /* size, or padding might be different for each platform.    */

    ca->ai_flags     = ai->ai_flags;
    ca->ai_family    = ai->ai_family;
    ca->ai_socktype  = ai->ai_socktype;
    ca->ai_protocol  = ai->ai_protocol;
    ca->ai_addrlen   = (curl_socklen_t)ss_size;
    ca->ai_addr      = NULL;
    ca->ai_canonname = NULL;
    ca->ai_next      = NULL;

    ca->ai_addr = malloc(ss_size);
    if(!ca->ai_addr) {
      error = EAI_MEMORY;
      free(ca);
      break;
    }
    memcpy(ca->ai_addr, ai->ai_addr, ss_size);

    if(ai->ai_canonname != NULL) {
      ca->ai_canonname = strdup(ai->ai_canonname);
      if(!ca->ai_canonname) {
        error = EAI_MEMORY;
        free(ca->ai_addr);
        free(ca);
        break;
      }
    }

    /* if the return list is empty, this becomes the first element */
    if(!cafirst)
      cafirst = ca;

    /* add this element last in the return list */
    if(calast)
      calast->ai_next = ca;
    calast = ca;

  }

  /* destroy the addrinfo list */
  if(aihead)
    freeaddrinfo(aihead);

  /* if we failed, also destroy the Curl_addrinfo list */
  if(error) {
    Curl_freeaddrinfo(cafirst);
    cafirst = NULL;
  }
  else if(!cafirst) {
#ifdef EAI_NONAME
    /* rfc3493 conformant */
    error = EAI_NONAME;
#else
    /* rfc3493 obsoleted */
    error = EAI_NODATA;
#endif
#ifdef USE_WINSOCK
    SET_SOCKERRNO(error);
#endif
  }

  *result = cafirst;

  /* This is not a CURLcode */
  return error;
}